

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydbalance.cpp
# Opt level: O3

double __thiscall
HydBalance::findHeadErrorNorm
          (HydBalance *this,double lamda,double *dH,double *dQ,double *xQ,Network *nw)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  double *extraout_RDX;
  double *__to;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  long *plVar4;
  
  this->maxFlowChangeLink = 0;
  this->maxHeadErr = 0.0;
  this->maxFlowChange = 0.0;
  uVar2 = Network::count(nw,LINK);
  dVar10 = 0.0;
  dVar8 = 0.0;
  if (0 < (int)uVar2) {
    uVar5 = 0;
    __to = extraout_RDX;
    do {
      iVar3 = Network::link(nw,(char *)(uVar5 & 0xffffffff),(char *)__to);
      plVar4 = (long *)CONCAT44(extraout_var,iVar3);
      iVar3 = *(int *)(plVar4[6] + 0x28);
      iVar1 = *(int *)(plVar4[7] + 0x28);
      dVar9 = dQ[uVar5];
      dVar6 = (double)plVar4[0xd] + dVar9 * lamda;
      xQ[iVar3] = xQ[iVar3] - dVar6;
      xQ[iVar1] = xQ[iVar1] + dVar6;
      dVar9 = ABS(dVar9 * lamda);
      if (this->maxFlowChange <= dVar9 && dVar9 != this->maxFlowChange) {
        this->maxFlowChange = dVar9;
        this->maxFlowChangeLink = (int)uVar5;
      }
      (**(code **)(*plVar4 + 0x90))(plVar4,nw);
      dVar9 = dH[iVar3] * lamda + *(double *)(plVar4[6] + 0x60);
      dVar6 = dH[iVar1] * lamda + *(double *)(plVar4[7] + 0x60);
      if (((double)plVar4[0x10] != 0.0) || (NAN((double)plVar4[0x10]))) {
        dVar7 = (double)plVar4[0xf];
      }
      else {
        dVar7 = dVar9 - dVar6;
        plVar4[0xf] = (long)dVar7;
      }
      dVar7 = (dVar9 - dVar6) - dVar7;
      dVar9 = ABS(dVar7);
      if (this->maxHeadErr <= dVar9 && dVar9 != this->maxHeadErr) {
        this->maxHeadErr = dVar9;
        this->maxHeadErrLink = (int)uVar5;
      }
      dVar8 = dVar8 + dVar7 * dVar7;
      dVar10 = dVar10 + 1.0;
      uVar5 = uVar5 + 1;
      __to = dH;
    } while (uVar2 != uVar5);
  }
  return (double)(~-(ulong)(dVar10 == 0.0) & (ulong)(dVar8 / dVar10));
}

Assistant:

double HydBalance::findHeadErrorNorm(
        double lamda, double dH[], double dQ[], double xQ[], Network* nw)
{
    double norm = 0.0;
    double count = 0.0;
    maxHeadErr = 0.0;
    maxFlowChange = 0.0;
    maxFlowChangeLink = 0;

    int linkCount = nw->count(Element::LINK);
    for (int i = 0; i < linkCount; i++)
    {
        // ... identify link's end nodes

        Link* link = nw->link(i);
        int n1 = link->fromNode->index;
        int n2 = link->toNode->index;

        // ... apply updated flow to end node flow balances

        double flowChange = lamda * dQ[i];
        double flow = link->flow + flowChange;
        xQ[n1] -= flow;
        xQ[n2] += flow;

        // ... update network's max. flow change

        double err = abs(flowChange);
        if ( err > maxFlowChange )
        {
            maxFlowChange = err;
            maxFlowChangeLink = i;
        }

        // ... compute head loss and its gradient (head loss is saved
        // ... to link->hLoss and its gradient to link->hGrad)
//*******************************************************************
        link->findHeadLoss(nw, flow);
//*******************************************************************

        // ... evaluate head loss error

        double h1 = link->fromNode->head + lamda * dH[n1];
        double h2 = link->toNode->head + lamda * dH[n2];
        if ( link->hGrad == 0.0 ) link->hLoss = h1 - h2;
        err = h1 - h2 - link->hLoss;
        if ( abs(err) > maxHeadErr )
        {
            maxHeadErr = abs(err);
            maxHeadErrLink = i;
        }

        // ... update sum of squared errors

        norm += err * err;
        count += 1.0;
    }

    // ... return sum of squared errors normalized by link count

    if ( count == 0.0 ) return 0;
    else return norm / count;

}